

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuadrature.h
# Opt level: O1

void chrono::ChQuadrature::Integrate3D<Eigen::Matrix<double,24,24,1,24,24>>
               (Matrix<double,_24,_24,_1,_24,_24> *result,
               ChIntegrable3D<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *integrand,double Xa,
               double Xb,double Ya,double Yb,double Za,double Zb,int order)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ChQuadratureTables *pCVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  ActualDstType actualDst;
  ulong uVar13;
  pointer pvVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  DstEvaluatorType dstEvaluator_1;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Matrix<double,_24,_24,_1,_24,_24> val;
  mul_assign_op<double,_double> local_1329;
  double local_1328;
  double local_1320;
  double local_1318;
  plainobjectbase_evaluator_data<double,_24> local_1310;
  ChQuadratureTables *local_1308;
  double local_1300;
  double local_12f8;
  double local_12f0;
  pointer local_12e8;
  double local_12e0;
  double local_12d8;
  double local_12d0;
  SrcEvaluatorType local_12c8;
  ulong local_12b8;
  ulong local_12b0;
  ChIntegrable3D<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *local_12a8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
  local_12a0;
  undefined1 local_1280 [64];
  undefined1 local_1240 [64];
  undefined1 local_1200 [64];
  undefined1 local_11c0 [64];
  undefined1 local_1180 [64];
  undefined1 local_1140 [64];
  undefined1 local_1100 [64];
  undefined1 local_10c0 [64];
  undefined1 local_1080 [64];
  undefined1 local_1040 [64];
  undefined1 local_1000 [64];
  undefined1 local_fc0 [64];
  undefined1 local_f80 [64];
  undefined1 local_f40 [64];
  
  local_1280._32_32_ = local_1280._56_32_;
  uVar13 = (ulong)(uint)order;
  local_1328 = Zb;
  local_1320 = Yb;
  local_1318 = Xb;
  local_1300 = Xa;
  local_12f8 = Ya;
  local_12f0 = Za;
  local_12a8 = integrand;
  pCVar4 = GetStaticTables();
  local_12b8 = ((long)(pCVar4->Lroots).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pCVar4->Lroots).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_12b0 = uVar13;
  if (local_12b8 < uVar13) {
    pCVar4 = (ChQuadratureTables *)::operator_new(0x30);
    ChQuadratureTables::ChQuadratureTables(pCVar4,order,order);
    ChQuadratureTables::PrintTables(pCVar4);
    local_12e8 = (pCVar4->Weight).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    pvVar14 = (pCVar4->Lroots).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_1308 = pCVar4;
  }
  else {
    local_1308 = GetStaticTables();
    pvVar14 = (local_1308->Lroots).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + (long)order + -1;
    local_12e8 = (local_1308->Weight).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)order + -1;
  }
  local_12d0 = (local_1318 - local_1300) * 0.5;
  local_12d8 = (local_1320 - local_12f8) * 0.5;
  local_12e0 = (local_1328 - local_12f0) * 0.5;
  local_12a0.m_dst = (DstEvaluatorType *)0x0;
  local_1280._8_8_ = &local_12a0;
  local_1280._0_8_ = &local_12c8;
  local_1280._16_8_ = &local_1310;
  local_1280._24_8_ = result;
  auVar19 = ZEXT1664(ZEXT816(0));
  auVar15 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])
                                    (result->
                                    super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                    ).m_storage.m_data.array);
  *(undefined1 (*) [64])
   (result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.array
       = auVar15;
  auVar15 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 8));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 8) = auVar15;
  auVar15 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x10));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x10) = auVar15;
  auVar15 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x18));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x18) = auVar15;
  auVar15 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x20));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x20) = auVar15;
  auVar15 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x28));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x28) = auVar15;
  auVar15 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x30));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x30) = auVar15;
  auVar15 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x38));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x38) = auVar15;
  auVar15 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x40));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x40) = auVar15;
  auVar15 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x48));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x48) = auVar15;
  auVar15 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x50));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x50) = auVar15;
  auVar15 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x58));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x58) = auVar15;
  auVar15 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x60));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x60) = auVar15;
  auVar15 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x68));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x68) = auVar15;
  local_12c8.m_functor.m_other = (double)result;
  Eigen::internal::
  copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_112,_576>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
         *)local_1280);
  if ((pvVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_finish !=
      (pvVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_start) {
    local_1318 = (local_1300 + local_1318) * 0.5;
    local_1320 = (local_12f8 + local_1320) * 0.5;
    local_1328 = (local_12f0 + local_1328) * 0.5;
    pvVar12 = (void *)0x0;
    do {
      if ((pvVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (pvVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        pvVar9 = (void *)0x0;
        do {
          lVar5 = *(long *)&(pvVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data;
          lVar7 = (long)(pvVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish - lVar5;
          if (lVar7 != 0) {
            pvVar8 = (void *)(lVar7 >> 3);
            pvVar11 = (void *)0x0;
            do {
              pvVar10 = pvVar12;
              if ((pvVar8 <= pvVar12) || (pvVar10 = pvVar9, pvVar8 <= pvVar9)) {
LAB_006e533d:
                uVar6 = std::__throw_out_of_range_fmt
                                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                   ,pvVar10);
                operator_delete(pvVar11,0x30);
                _Unwind_Resume(uVar6);
              }
              auVar16._8_8_ = 0;
              auVar16._0_8_ = *(ulong *)(lVar5 + (long)pvVar12 * 8);
              auVar20._8_8_ = 0;
              auVar20._0_8_ = local_1318;
              auVar1._8_8_ = 0;
              auVar1._0_8_ = local_12d0;
              vfmadd132sd_fma(auVar16,auVar20,auVar1);
              auVar21._8_8_ = 0;
              auVar21._0_8_ = *(ulong *)(lVar5 + (long)pvVar9 * 8);
              auVar22._8_8_ = 0;
              auVar22._0_8_ = local_1320;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = local_12d8;
              vfmadd132sd_fma(auVar21,auVar22,auVar2);
              auVar23._8_8_ = 0;
              auVar23._0_8_ = *(ulong *)(lVar5 + (long)pvVar11 * 8);
              auVar24._8_8_ = 0;
              auVar24._0_8_ = local_1328;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = local_12e0;
              vfmadd132sd_fma(auVar23,auVar24,auVar3);
              (*local_12a8->_vptr_ChIntegrable3D[2])(local_12a8,local_1280);
              lVar5 = *(long *)&(local_12e8->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl;
              pvVar8 = (void *)((long)(local_12e8->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data._M_finish - lVar5 >> 3);
              pvVar10 = pvVar12;
              if ((pvVar8 <= pvVar12) ||
                 ((pvVar10 = pvVar9, pvVar8 <= pvVar9 || (pvVar10 = pvVar11, pvVar8 <= pvVar11))))
              goto LAB_006e533d;
              local_12c8.m_functor.m_other =
                   *(double *)(lVar5 + (long)pvVar12 * 8) * *(double *)(lVar5 + (long)pvVar9 * 8) *
                   *(double *)(lVar5 + (long)pvVar11 * 8);
              local_1310.data = (double *)local_1280;
              local_12a0.m_dst = (DstEvaluatorType *)&local_1310;
              local_12a0.m_src = &local_12c8;
              local_12a0.m_functor = &local_1329;
              auVar17._8_8_ = 0;
              auVar17._0_8_ = local_12c8.m_functor.m_other;
              auVar15 = vbroadcastsd_avx512f(auVar17);
              local_1280 = vmulpd_avx512f(auVar15,local_1280);
              local_1240 = vmulpd_avx512f(auVar15,local_1240);
              local_1200 = vmulpd_avx512f(auVar15,local_1200);
              local_11c0 = vmulpd_avx512f(auVar15,local_11c0);
              local_1180 = vmulpd_avx512f(auVar15,local_1180);
              local_1140 = vmulpd_avx512f(auVar15,local_1140);
              local_1100 = vmulpd_avx512f(auVar15,local_1100);
              local_10c0 = vmulpd_avx512f(auVar15,local_10c0);
              local_1080 = vmulpd_avx512f(auVar15,local_1080);
              local_1040 = vmulpd_avx512f(auVar15,local_1040);
              local_1000 = vmulpd_avx512f(auVar15,local_1000);
              local_fc0 = vmulpd_avx512f(auVar15,local_fc0);
              local_f80 = vmulpd_avx512f(auVar15,local_f80);
              local_f40 = vmulpd_avx512f(auVar15,local_f40);
              local_12a0.m_dstExpr = (DstXprType *)local_1310.data;
              Eigen::internal::
              copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_112,_576>
              ::run(&local_12a0);
              lVar5 = 0x80;
              do {
                auVar15 = vaddpd_avx512f(*(undefined1 (*) [64])((long)&local_1300 + lVar5),
                                         *(undefined1 (*) [64])
                                          ((long)(result->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                                 ).m_storage.m_data.array + lVar5 + -0x80));
                *(undefined1 (*) [64])
                 ((long)(result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).
                        m_storage.m_data.array + lVar5 + -0x80) = auVar15;
                auVar15 = vaddpd_avx512f(*(undefined1 (*) [64])(&local_12c8.field_0x8 + lVar5),
                                         *(undefined1 (*) [64])
                                          ((long)(result->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                                 ).m_storage.m_data.array + lVar5 + -0x40));
                *(undefined1 (*) [64])
                 ((long)(result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).
                        m_storage.m_data.array + lVar5 + -0x40) = auVar15;
                auVar15 = vaddpd_avx512f(*(undefined1 (*) [64])(local_1280 + lVar5),
                                         *(undefined1 (*) [64])
                                          ((long)(result->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                                 ).m_storage.m_data.array + lVar5));
                *(undefined1 (*) [64])
                 ((long)(result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).
                        m_storage.m_data.array + lVar5) = auVar15;
                lVar5 = lVar5 + 0xc0;
              } while (lVar5 != 0x1280);
              pvVar11 = (void *)(ulong)((int)pvVar11 + 1);
              lVar5 = *(long *)&(pvVar14->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data;
              pvVar8 = (void *)((long)(pvVar14->super__Vector_base<double,_std::allocator<double>_>)
                                      ._M_impl.super__Vector_impl_data._M_finish - lVar5 >> 3);
            } while (pvVar11 < pvVar8);
          }
          pvVar9 = (void *)(ulong)((int)pvVar9 + 1);
        } while (pvVar9 < (void *)((long)(pvVar14->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   *(long *)&(pvVar14->
                                             super__Vector_base<double,_std::allocator<double>_>).
                                             _M_impl.super__Vector_impl_data >> 3));
      }
      pvVar12 = (void *)(ulong)((int)pvVar12 + 1);
    } while (pvVar12 < (void *)((long)(pvVar14->super__Vector_base<double,_std::allocator<double>_>)
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                *(long *)&(pvVar14->
                                          super__Vector_base<double,_std::allocator<double>_>).
                                          _M_impl.super__Vector_impl_data >> 3));
  }
  local_12c8.m_functor.m_other = local_12d8 * local_12d0 * local_12e0;
  local_12a0.m_dst = (DstEvaluatorType *)&local_1310;
  local_12a0.m_src = &local_12c8;
  local_12a0.m_functor = &local_1329;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_12c8.m_functor.m_other;
  auVar15 = vbroadcastsd_avx512f(auVar18);
  auVar19 = vmulpd_avx512f(auVar15,*(undefined1 (*) [64])
                                    (result->
                                    super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                    ).m_storage.m_data.array);
  *(undefined1 (*) [64])
   (result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.array
       = auVar19;
  auVar19 = vmulpd_avx512f(auVar15,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 8));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 8) = auVar19;
  auVar19 = vmulpd_avx512f(auVar15,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x10));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x10) = auVar19;
  auVar19 = vmulpd_avx512f(auVar15,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x18));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x18) = auVar19;
  auVar19 = vmulpd_avx512f(auVar15,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x20));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x20) = auVar19;
  auVar19 = vmulpd_avx512f(auVar15,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x28));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x28) = auVar19;
  auVar19 = vmulpd_avx512f(auVar15,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x30));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x30) = auVar19;
  auVar19 = vmulpd_avx512f(auVar15,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x38));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x38) = auVar19;
  auVar19 = vmulpd_avx512f(auVar15,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x40));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x40) = auVar19;
  auVar19 = vmulpd_avx512f(auVar15,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x48));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x48) = auVar19;
  auVar19 = vmulpd_avx512f(auVar15,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x50));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x50) = auVar19;
  auVar19 = vmulpd_avx512f(auVar15,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x58));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x58) = auVar19;
  auVar19 = vmulpd_avx512f(auVar15,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x60));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x60) = auVar19;
  auVar15 = vmulpd_avx512f(auVar15,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x68));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x68) = auVar15;
  local_1310.data = (double *)result;
  local_12a0.m_dstExpr = result;
  Eigen::internal::
  copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_112,_576>
  ::run(&local_12a0);
  pCVar4 = local_1308;
  if (local_12b8 < local_12b0) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_1308->Lroots);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&pCVar4->Weight);
    operator_delete(pCVar4,0x30);
  }
  return;
}

Assistant:

static void Integrate3D(T& result,                     ///< result is returned here
                            ChIntegrable3D<T>& integrand,  ///< this is the integrand
                            const double Xa,               ///< min limit for x domain
                            const double Xb,               ///< min limit for x domain
                            const double Ya,               ///< min limit for y domain
                            const double Yb,               ///< min limit for y domain
                            const double Za,               ///< min limit for z domain
                            const double Zb,               ///< min limit for z domain
                            const int order)               ///< order of integration
    {
        ChQuadratureTables* mtables = 0;
        std::vector<double>* lroots;
        std::vector<double>* weight;
        bool static_tables;

        if ((unsigned int)order <= GetStaticTables()->Lroots.size()) {
            mtables = GetStaticTables();
            lroots = &mtables->Lroots[order - 1];
            weight = &mtables->Weight[order - 1];
            static_tables = true;
        } else {
            mtables = new ChQuadratureTables(order, order);
            mtables->PrintTables();
            lroots = &mtables->Lroots[0];
            weight = &mtables->Weight[0];
            static_tables = false;
        }

        double Xc1 = (Xb - Xa) / 2;
        double Xc2 = (Xb + Xa) / 2;
        double Yc1 = (Yb - Ya) / 2;
        double Yc2 = (Yb + Ya) / 2;
        double Zc1 = (Zb - Za) / 2;
        double Zc2 = (Zb + Za) / 2;

        result *= 0;  // as result = 0, but works also for matrices.
        T val;        // temporary value for loop

        for (unsigned int ix = 0; ix < lroots->size(); ix++)
            for (unsigned int iy = 0; iy < lroots->size(); iy++)
                for (unsigned int iz = 0; iz < lroots->size(); iz++) {
                    integrand.Evaluate(val, (Xc1 * lroots->at(ix) + Xc2), (Yc1 * lroots->at(iy) + Yc2),
                                       (Zc1 * lroots->at(iz) + Zc2));
                    val *= (weight->at(ix) * weight->at(iy) * weight->at(iz));
                    result += val;
                }
        result *= (Xc1 * Yc1 * Zc1);

        if (!static_tables)
            delete mtables;
    }